

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall cmMakefileTargetGenerator::CloseFileStreams(cmMakefileTargetGenerator *this)

{
  if (this->BuildFileStream != (cmGeneratedFileStream *)0x0) {
    (*(this->BuildFileStream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream[1])();
  }
  if (this->InfoFileStream != (cmGeneratedFileStream *)0x0) {
    (*(this->InfoFileStream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream[1])();
  }
  if (this->FlagFileStream != (cmGeneratedFileStream *)0x0) {
    (*(this->FlagFileStream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream[1])();
    return;
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::CloseFileStreams()
{
  delete this->BuildFileStream;
  delete this->InfoFileStream;
  delete this->FlagFileStream;
}